

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# overlay.tpl.h
# Opt level: O2

void __thiscall
r_exec::Controller::__take_input<r_exec::PGMController>(Controller *this,View *input)

{
  ReductionJob<r_exec::PGMController> *this_00;
  _Mem *this_01;
  
  this_00 = (ReductionJob<r_exec::PGMController> *)operator_new(0x28);
  ReductionJob<r_exec::PGMController>::ReductionJob(this_00,input,(PGMController *)this);
  this_01 = (_Mem *)r_code::Mem::Get();
  _Mem::pushReductionJob(this_01,(_ReductionJob *)this_00);
  return;
}

Assistant:

void Controller::__take_input(r_exec::View *input)   // utility: to be called by sub-classes.
{
    ReductionJob<C> *j = new ReductionJob<C>(input/*_view*/, (C *)this);
    _Mem::Get()->pushReductionJob(j);
}